

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereSphereCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btSphereSphereCollisionAlgorithm::processCollision
          (btSphereSphereCollisionAlgorithm *this,btCollisionObjectWrapper *col0Wrap,
          btCollisionObjectWrapper *col1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  btTransform *pbVar1;
  btVector3 *v2;
  btVector3 *s;
  btCollisionObjectWrapper *in_RDX;
  btCollisionObjectWrapper *in_RSI;
  btVector3 *in_RDI;
  btManifoldResult *in_R8;
  btVector3 bVar2;
  btVector3 pos1;
  btVector3 normalOnSurfaceB;
  btScalar dist;
  btScalar radius1;
  btScalar radius0;
  btScalar len;
  btVector3 diff;
  btSphereShape *sphere1;
  btSphereShape *sphere0;
  btVector3 *in_stack_ffffffffffffff38;
  btSphereShape *in_stack_ffffffffffffff40;
  undefined1 local_94 [4];
  btManifoldResult *this_00;
  btScalar local_84 [2];
  btScalar local_7c [2];
  btScalar local_74;
  btScalar local_70;
  btScalar local_6c;
  btVector3 local_68;
  float local_58;
  btScalar local_54;
  float local_50;
  btScalar local_4c;
  btScalar local_48 [4];
  btCollisionShape *local_38;
  btCollisionShape *local_30;
  btManifoldResult *local_28;
  btCollisionObjectWrapper *local_18;
  btCollisionObjectWrapper *local_10;
  
  if (*(long *)(in_RDI[1].m_floats + 2) != 0) {
    local_28 = in_R8;
    local_18 = in_RDX;
    local_10 = in_RSI;
    btManifoldResult::setPersistentManifold
              (in_R8,*(btPersistentManifold **)(in_RDI[1].m_floats + 2));
    local_30 = btCollisionObjectWrapper::getCollisionShape(local_10);
    local_38 = btCollisionObjectWrapper::getCollisionShape(local_18);
    pbVar1 = btCollisionObjectWrapper::getWorldTransform(local_10);
    v2 = btTransform::getOrigin(pbVar1);
    pbVar1 = btCollisionObjectWrapper::getWorldTransform(local_18);
    btTransform::getOrigin(pbVar1);
    local_48 = (btScalar  [4])operator-(in_RDI,v2);
    local_4c = btVector3::length((btVector3 *)0x1a4273);
    local_50 = btSphereShape::getRadius(in_stack_ffffffffffffff40);
    local_54 = btSphereShape::getRadius(in_stack_ffffffffffffff40);
    if (local_4c <= local_50 + local_54) {
      local_58 = local_4c - (local_50 + local_54);
      local_6c = 1.0;
      local_70 = 0.0;
      local_74 = 0.0;
      btVector3::btVector3(&local_68,&local_6c,&local_70,&local_74);
      if (1.1920929e-07 < local_4c) {
        bVar2 = operator/((btVector3 *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38->m_floats
                         );
        local_84 = bVar2.m_floats._0_8_;
        local_68.m_floats[0] = local_84[0];
        local_68.m_floats[1] = local_84[1];
        local_7c = bVar2.m_floats._8_8_;
        local_68.m_floats[2] = local_7c[0];
        local_68.m_floats[3] = local_7c[1];
      }
      pbVar1 = btCollisionObjectWrapper::getWorldTransform(local_18);
      s = btTransform::getOrigin(pbVar1);
      ::operator*(s->m_floats,in_stack_ffffffffffffff38);
      _local_94 = operator+(in_RDI,v2);
      (*(local_28->super_Result)._vptr_Result[4])((ulong)(uint)local_58,local_28,&local_68,local_94)
      ;
      btManifoldResult::refreshContactPoints(this_00);
    }
    else {
      btManifoldResult::refreshContactPoints(this_00);
    }
  }
  return;
}

Assistant:

void btSphereSphereCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* col0Wrap,const btCollisionObjectWrapper* col1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	(void)dispatchInfo;

	if (!m_manifoldPtr)
		return;

	resultOut->setPersistentManifold(m_manifoldPtr);

	btSphereShape* sphere0 = (btSphereShape*)col0Wrap->getCollisionShape();
	btSphereShape* sphere1 = (btSphereShape*)col1Wrap->getCollisionShape();

	btVector3 diff = col0Wrap->getWorldTransform().getOrigin()-  col1Wrap->getWorldTransform().getOrigin();
	btScalar len = diff.length();
	btScalar radius0 = sphere0->getRadius();
	btScalar radius1 = sphere1->getRadius();

#ifdef CLEAR_MANIFOLD
	m_manifoldPtr->clearManifold(); //don't do this, it disables warmstarting
#endif

	///iff distance positive, don't generate a new contact
	if ( len > (radius0+radius1))
	{
#ifndef CLEAR_MANIFOLD
		resultOut->refreshContactPoints();
#endif //CLEAR_MANIFOLD
		return;
	}
	///distance (negative means penetration)
	btScalar dist = len - (radius0+radius1);

	btVector3 normalOnSurfaceB(1,0,0);
	if (len > SIMD_EPSILON)
	{
		normalOnSurfaceB = diff / len;
	}

	///point on A (worldspace)
	///btVector3 pos0 = col0->getWorldTransform().getOrigin() - radius0 * normalOnSurfaceB;
	///point on B (worldspace)
	btVector3 pos1 = col1Wrap->getWorldTransform().getOrigin() + radius1* normalOnSurfaceB;

	/// report a contact. internally this will be kept persistent, and contact reduction is done
	
	
	resultOut->addContactPoint(normalOnSurfaceB,pos1,dist);

#ifndef CLEAR_MANIFOLD
	resultOut->refreshContactPoints();
#endif //CLEAR_MANIFOLD

}